

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall
CFFFileInput::ReadCFFFile(CFFFileInput *this,IByteReaderWithPosition *inCFFFile)

{
  int iVar1;
  undefined4 extraout_var;
  Trace *pTVar2;
  EStatusCode local_1c;
  EStatusCode status;
  IByteReaderWithPosition *inCFFFile_local;
  CFFFileInput *this_local;
  
  FreeData(this);
  CFFPrimitiveReader::SetStream(&this->mPrimitivesReader,inCFFFile);
  iVar1 = (*(inCFFFile->super_IByteReader)._vptr_IByteReader[6])();
  this->mCFFOffset = CONCAT44(extraout_var,iVar1);
  local_1c = ReadHeader(this);
  if (local_1c == eSuccess) {
    if (4 < (this->mHeader).hdrSize) {
      CFFPrimitiveReader::Skip(&this->mPrimitivesReader,(long)(int)((this->mHeader).hdrSize - 4));
    }
    local_1c = ReadNameIndex(this);
    if (local_1c == eSuccess) {
      local_1c = ReadTopDictIndex(this);
      if (local_1c == eSuccess) {
        local_1c = ReadStringIndex(this);
        if (local_1c == eSuccess) {
          local_1c = ReadGlobalSubrs(this);
          if (local_1c == eSuccess) {
            local_1c = ReadCharStrings(this);
            if (local_1c == eSuccess) {
              local_1c = ReadPrivateDicts(this);
              if (local_1c == eSuccess) {
                local_1c = ReadLocalSubrs(this);
                if (local_1c == eSuccess) {
                  local_1c = ReadCharsets(this);
                  if (local_1c == eSuccess) {
                    local_1c = ReadEncodings(this);
                    if (local_1c == eSuccess) {
                      local_1c = ReadCIDInformation(this);
                      if (local_1c != eSuccess) {
                        pTVar2 = Trace::DefaultTrace();
                        Trace::TraceToLog(pTVar2,
                                          "CFFFileInput::ReadCFFFile failed to read CID Information"
                                         );
                      }
                    }
                    else {
                      pTVar2 = Trace::DefaultTrace();
                      Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read encodings")
                      ;
                    }
                  }
                  else {
                    pTVar2 = Trace::DefaultTrace();
                    Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read char set");
                  }
                }
                else {
                  pTVar2 = Trace::DefaultTrace();
                  Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read local subrs");
                }
              }
              else {
                pTVar2 = Trace::DefaultTrace();
                Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read charstrings");
              }
            }
            else {
              pTVar2 = Trace::DefaultTrace();
              Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read charstrings");
            }
          }
          else {
            pTVar2 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read global subrs");
          }
        }
        else {
          pTVar2 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read top index");
        }
      }
      else {
        pTVar2 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile failed to read top index");
      }
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile Failed to read name");
    }
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,"CFFFileInput::ReadCFFFile, Failed to read header");
  }
  return local_1c;
}

Assistant:

EStatusCode CFFFileInput::ReadCFFFile(IByteReaderWithPosition* inCFFFile)
{
	EStatusCode status;

	do
	{
		FreeData();

		mPrimitivesReader.SetStream(inCFFFile);
		mCFFOffset = inCFFFile->GetCurrentPosition();

		status = ReadHeader();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile, Failed to read header");
				break;
		}

		// skip to name
		if(mHeader.hdrSize > 4)
			mPrimitivesReader.Skip(mHeader.hdrSize - 4);

		status = ReadNameIndex();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile Failed to read name");
				break;
		}

		status = ReadTopDictIndex();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read top index");
			break;
		}

		status = ReadStringIndex();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read top index");
			break;
		}

		status = ReadGlobalSubrs();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read global subrs");
			break;
		}

		status = ReadCharStrings();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read charstrings");
			break;
		}

		status = ReadPrivateDicts();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read charstrings");
			break;
		}

		status = ReadLocalSubrs();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read local subrs");
			break;
		}

		status = ReadCharsets();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read char set");
			break;
		}

		status = ReadEncodings();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read encodings");
			break;
		}
		
		status = ReadCIDInformation();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read CID Information");
			break;
		}

	}while(false);
	return status;
}